

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

FaceHandle __thiscall
OpenMesh::PolyConnectivity::add_face
          (PolyConnectivity *this,VertexHandle *_vertex_handles,size_t _vhs_size)

{
  pointer *ppFVar1;
  VertexHandle _vh;
  pointer pAVar2;
  pointer ppVar3;
  iterator __position;
  pointer ppBVar4;
  BaseProperty *pBVar5;
  VertexHandle *pVVar6;
  size_t sVar7;
  bool bVar8;
  BaseHandle BVar9;
  int iVar10;
  BaseHandle BVar11;
  uint uVar12;
  Halfedge *pHVar13;
  undefined4 extraout_var;
  Face *pFVar14;
  Vertex *pVVar15;
  mostream *pmVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  BaseHandle BVar21;
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  *pvVar22;
  ulong uVar23;
  pointer ppBVar24;
  Face local_68;
  BaseHandle local_64;
  VertexHandle *local_60;
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  *local_58;
  BaseHandle local_4c;
  long local_48;
  size_t local_40;
  BaseHandle local_38;
  BaseHandle local_34;
  
  pvVar22 = &this->edgeData_;
  local_40 = _vhs_size;
  if ((ulong)((long)(this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < _vhs_size) {
    std::
    vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
    ::resize(pvVar22,_vhs_size);
    std::
    vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
    ::resize(&this->next_cache_,local_40 * 6);
  }
  this->next_cache_count_ = 0;
  if (local_40 < 3) {
    __assert_fail("n > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x86,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                 );
  }
  uVar17 = 1;
  uVar23 = 0;
  while( true ) {
    bVar8 = is_boundary(this,(VertexHandle)_vertex_handles[uVar23].super_BaseHandle.idx_);
    if (!bVar8) {
      pmVar16 = omerr();
      pcVar18 = "PolyMeshT::add_face: complex vertex\n";
      lVar20 = 0x24;
      goto LAB_0018fcb5;
    }
    BVar9.idx_ = (int)find_halfedge(this,_vertex_handles[uVar23].super_BaseHandle.idx_,
                                    _vertex_handles[uVar17].super_BaseHandle.idx_);
    (this->edgeData_).
    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar23].halfedge_handle.super_BaseHandle.idx_ =
         BVar9.idx_;
    pAVar2 = (this->edgeData_).
             super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    BVar9.idx_ = pAVar2[uVar23].halfedge_handle.super_BaseHandle.idx_;
    pAVar2[uVar23].is_new = BVar9.idx_ == -1;
    pAVar2[uVar23].needs_adjust = false;
    if ((BVar9.idx_ != -1) &&
       (pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_),
       (pHVar13->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1)) break;
    uVar23 = uVar23 + 1;
    uVar17 = uVar17 + 1;
    if (uVar17 == local_40) {
      uVar17 = 0;
    }
    if (local_40 == uVar23) {
      uVar23 = 1;
      uVar19 = 0;
      uVar17 = local_40;
      local_60 = _vertex_handles;
      local_58 = pvVar22;
      do {
        pAVar2 = (pvVar22->
                 super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((pAVar2[uVar19].is_new == false) && (pAVar2[uVar23].is_new == false)) {
          BVar9.idx_ = pAVar2[uVar19].halfedge_handle.super_BaseHandle.idx_;
          BVar11.idx_ = pAVar2[uVar23].halfedge_handle.super_BaseHandle.idx_;
          pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_);
          uVar17 = local_40;
          pvVar22 = local_58;
          if ((pHVar13->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_ !=
              BVar11.idx_) {
            BVar21.idx_ = (-(BVar11.idx_ & 1U) | 1) + BVar11.idx_;
            local_38.idx_ = BVar11.idx_;
            do {
              do {
                pHVar13 = ArrayKernel::halfedge
                                    (&this->super_ArrayKernel,(HalfedgeHandle)BVar21.idx_);
                uVar12 = (pHVar13->super_Halfedge_without_prev).next_halfedge_handle_.
                         super_BaseHandle.idx_;
                BVar21.idx_ = (-(uVar12 & 1) | 1) + uVar12;
                pHVar13 = ArrayKernel::halfedge
                                    (&this->super_ArrayKernel,(HalfedgeHandle)BVar21.idx_);
              } while ((pHVar13->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ !=
                       -1);
            } while (BVar21.idx_ == BVar9.idx_);
            pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar21.idx_);
            local_48 = CONCAT44(local_48._4_4_,
                                (pHVar13->super_Halfedge_without_prev).next_halfedge_handle_.
                                super_BaseHandle.idx_);
            pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar21.idx_);
            if ((pHVar13->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1) {
              __assert_fail("is_boundary(boundary_prev)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xb5,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,local_48._0_4_);
            if ((pHVar13->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1) {
              __assert_fail("is_boundary(boundary_next)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xb6,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_48._0_4_ == (BaseHandle)local_38.idx_) {
              pmVar16 = omerr();
              pcVar18 = "PolyMeshT::add_face: patch re-linking failed\n";
              lVar20 = 0x2d;
LAB_0018fcb5:
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pmVar16->super_ostream,pcVar18,lVar20);
              return (FaceHandle)InvalidFaceHandle;
            }
            pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_);
            local_34.idx_ =
                 (pHVar13->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
            pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)local_38.idx_);
            if (BVar21.idx_ == -1) {
              __assert_fail("boundary_prev.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc2,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_34.idx_ == -1) {
              __assert_fail("patch_start.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc3,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            BVar11.idx_ = (pHVar13->prev_halfedge_handle_).super_BaseHandle.idx_;
            if (BVar11.idx_ == -1) {
              __assert_fail("patch_end.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc4,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_48._0_4_ == -1) {
              __assert_fail("boundary_next.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc5,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (BVar9.idx_ == -1) {
              __assert_fail("inner_prev.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc6,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_38.idx_ == 0xffffffff) {
              __assert_fail("inner_next.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,199,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            uVar12 = this->next_cache_count_;
            this->next_cache_count_ = uVar12 + 1;
            ppVar3 = (this->next_cache_).
                     super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar21.idx_;
            ppVar3[uVar12].second.super_BaseHandle.idx_ = local_34.idx_;
            uVar12 = this->next_cache_count_;
            this->next_cache_count_ = uVar12 + 1;
            ppVar3 = (this->next_cache_).
                     super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar11.idx_;
            ppVar3[uVar12].second.super_BaseHandle.idx_ = (int)local_48._0_4_;
            uVar12 = this->next_cache_count_;
            this->next_cache_count_ = uVar12 + 1;
            ppVar3 = (this->next_cache_).
                     super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar9.idx_;
            ppVar3[uVar12].second.super_BaseHandle.idx_ = local_38.idx_;
            uVar17 = local_40;
            pvVar22 = local_58;
          }
        }
        pVVar6 = local_60;
        uVar19 = uVar19 + 1;
        uVar23 = (uVar23 + 1) % uVar17;
        if (uVar19 == uVar17) {
          uVar23 = 1;
          uVar19 = 0;
          do {
            if ((pvVar22->
                super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar19].is_new == true) {
              BVar9.idx_ = (int)ArrayKernel::new_edge
                                          (&this->super_ArrayKernel,
                                           pVVar6[uVar19].super_BaseHandle.idx_,
                                           pVVar6[uVar23].super_BaseHandle.idx_);
              (this->edgeData_).
              super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar19].halfedge_handle.super_BaseHandle.
              idx_ = BVar9.idx_;
              uVar17 = local_40;
            }
            uVar19 = uVar19 + 1;
            uVar23 = (uVar23 + 1) % uVar17;
          } while (uVar17 != uVar19);
          local_68.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
          __position._M_current =
               (this->super_ArrayKernel).faces_.
               super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->super_ArrayKernel).faces_.
              super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
            _M_realloc_insert<OpenMesh::ArrayItems::Face>
                      (&(this->super_ArrayKernel).faces_,__position,&local_68);
          }
          else {
            ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
            ppFVar1 = &(this->super_ArrayKernel).faces_.
                       super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppFVar1 = *ppFVar1 + 1;
          }
          iVar10 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])(this);
          ppBVar4 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                    super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppBVar24 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                          super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppBVar24 != ppBVar4;
              ppBVar24 = ppBVar24 + 1) {
            pBVar5 = *ppBVar24;
            if (pBVar5 != (BaseProperty *)0x0) {
              (*pBVar5->_vptr_BaseProperty[3])(pBVar5,CONCAT44(extraout_var,iVar10));
            }
          }
          BVar11.idx_ = (int)ArrayKernel::handle(&this->super_ArrayKernel,
                                                 (this->super_ArrayKernel).faces_.
                                                 super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + -1);
          sVar7 = local_40;
          BVar9.idx_ = (this->edgeData_).
                       super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_40 - 1].halfedge_handle.
                       super_BaseHandle.idx_;
          pFVar14 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)BVar11.idx_);
          (pFVar14->halfedge_handle_).super_BaseHandle.idx_ = BVar9.idx_;
          local_48 = sVar7 + (sVar7 == 0);
          uVar17 = 1;
          lVar20 = 0;
          local_4c.idx_ = BVar11.idx_;
          do {
            pAVar2 = (local_58->
                     super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            BVar9.idx_ = pAVar2[lVar20].halfedge_handle.super_BaseHandle.idx_;
            if (BVar9.idx_ == -1) {
              __assert_fail("inner_prev.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xe1,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            BVar21.idx_ = pAVar2[uVar17].halfedge_handle.super_BaseHandle.idx_;
            if (BVar21.idx_ == -1) {
              __assert_fail("inner_next.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xe2,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            _vh.super_BaseHandle.idx_ = (BaseHandle)local_60[uVar17].super_BaseHandle.idx_;
            uVar12 = pAVar2[lVar20].is_new + 2;
            if (pAVar2[uVar17].is_new == false) {
              uVar12 = (uint)pAVar2[lVar20].is_new;
            }
            if (uVar12 == 0) {
              pVVar15 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
              (this->edgeData_).
              super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].needs_adjust =
                   (pVVar15->halfedge_handle_).super_BaseHandle.idx_ == BVar21.idx_;
            }
            else {
              BVar11.idx_ = (-(BVar21.idx_ & 1U) | 1) + BVar21.idx_;
              local_38.idx_ = BVar21.idx_;
              if (BVar11.idx_ == -1) {
                __assert_fail("outer_prev.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0xed,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              iVar10 = (-(BVar9.idx_ & 1U) | 1) + BVar9.idx_;
              if (iVar10 == -1) {
                __assert_fail("outer_next.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0xee,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              local_64.idx_ = BVar9.idx_;
              local_34.idx_ = (int)_vh.super_BaseHandle.idx_;
              if (uVar12 == 3) {
                pVVar15 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
                if ((pVVar15->halfedge_handle_).super_BaseHandle.idx_ == -1) {
                  pVVar15 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_
                                               );
                  (pVVar15->halfedge_handle_).super_BaseHandle.idx_ = iVar10;
                  uVar12 = this->next_cache_count_;
                  this->next_cache_count_ = uVar12 + 1;
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar11.idx_;
                  ppVar3[uVar12].second.super_BaseHandle.idx_ = iVar10;
                  BVar21.idx_ = local_38.idx_;
                }
                else {
                  pVVar15 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_
                                               );
                  local_34.idx_ = (pVVar15->halfedge_handle_).super_BaseHandle.idx_;
                  pHVar13 = ArrayKernel::halfedge
                                      (&this->super_ArrayKernel,(HalfedgeHandle)local_34.idx_);
                  BVar9.idx_ = (pHVar13->prev_halfedge_handle_).super_BaseHandle.idx_;
                  if (BVar9.idx_ == -1) {
                    __assert_fail("boundary_prev.is_valid()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                  ,0x10b,
                                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                                 );
                  }
                  if (local_34.idx_ == -1) {
                    __assert_fail("boundary_next.is_valid()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                  ,0x10c,
                                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                                 );
                  }
                  uVar12 = this->next_cache_count_;
                  this->next_cache_count_ = uVar12 + 1;
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar9.idx_;
                  ppVar3[uVar12].second.super_BaseHandle.idx_ = iVar10;
                  uVar12 = this->next_cache_count_;
                  this->next_cache_count_ = uVar12 + 1;
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar11.idx_;
                  ppVar3[uVar12].second.super_BaseHandle.idx_ = local_34.idx_;
                  BVar21.idx_ = local_38.idx_;
                }
              }
              else if (uVar12 == 2) {
                pHVar13 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_)
                ;
                iVar10 = (pHVar13->super_Halfedge_without_prev).next_halfedge_handle_.
                         super_BaseHandle.idx_;
                if (iVar10 == -1) {
                  __assert_fail("boundary_next.is_valid()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                ,0xfc,
                                "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                               );
                }
                uVar12 = this->next_cache_count_;
                this->next_cache_count_ = uVar12 + 1;
                ppVar3 = (this->next_cache_).
                         super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar11.idx_;
                ppVar3[uVar12].second.super_BaseHandle.idx_ = iVar10;
                pVVar15 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
                (pVVar15->halfedge_handle_).super_BaseHandle.idx_ = iVar10;
                BVar21.idx_ = local_38.idx_;
              }
              else {
                pHVar13 = ArrayKernel::halfedge
                                    (&this->super_ArrayKernel,(HalfedgeHandle)BVar21.idx_);
                BVar9.idx_ = (pHVar13->prev_halfedge_handle_).super_BaseHandle.idx_;
                if (BVar9.idx_ == -1) {
                  __assert_fail("boundary_prev.is_valid()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                ,0xf5,
                                "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                               );
                }
                uVar12 = this->next_cache_count_;
                this->next_cache_count_ = uVar12 + 1;
                ppVar3 = (this->next_cache_).
                         super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar3[uVar12].first.super_BaseHandle.idx_ = BVar9.idx_;
                ppVar3[uVar12].second.super_BaseHandle.idx_ = iVar10;
                pVVar15 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
                (pVVar15->halfedge_handle_).super_BaseHandle.idx_ = iVar10;
              }
              uVar12 = this->next_cache_count_;
              this->next_cache_count_ = uVar12 + 1;
              ppVar3 = (this->next_cache_).
                       super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar3[uVar12].first.super_BaseHandle.idx_ = local_64.idx_;
              ppVar3[uVar12].second.super_BaseHandle.idx_ = BVar21.idx_;
              BVar11.idx_ = local_4c.idx_;
            }
            pHVar13 = ArrayKernel::halfedge
                                (&this->super_ArrayKernel,
                                 (HalfedgeHandle)
                                 (this->edgeData_).
                                 super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].halfedge_handle.
                                 super_BaseHandle.idx_);
            (pHVar13->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = BVar11.idx_;
            lVar20 = lVar20 + 1;
            uVar17 = (uVar17 + 1) % local_40;
            if (local_48 == lVar20) {
              if (this->next_cache_count_ != 0) {
                uVar17 = 0;
                do {
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ArrayKernel::set_next_halfedge_handle
                            (&this->super_ArrayKernel,
                             (HalfedgeHandle)ppVar3[uVar17].first.super_BaseHandle.idx_,
                             (HalfedgeHandle)ppVar3[uVar17].second.super_BaseHandle.idx_);
                  uVar17 = uVar17 + 1;
                } while (uVar17 < this->next_cache_count_);
              }
              pvVar22 = local_58;
              pVVar6 = local_60;
              lVar20 = 0;
              do {
                if ((pvVar22->
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar20].needs_adjust == true) {
                  adjust_outgoing_halfedge(this,(VertexHandle)pVVar6[lVar20].super_BaseHandle.idx_);
                }
                lVar20 = lVar20 + 1;
              } while (local_48 != lVar20);
              return (BaseHandle)(BaseHandle)local_4c.idx_;
            }
          } while( true );
        }
      } while( true );
    }
  }
  pmVar16 = omerr();
  pcVar18 = "PolyMeshT::add_face: complex edge\n";
  lVar20 = 0x22;
  goto LAB_0018fcb5;
}

Assistant:

PolyConnectivity::FaceHandle
PolyConnectivity::add_face(const VertexHandle* _vertex_handles, size_t _vhs_size)
{
  VertexHandle                   vh;
  size_t                         i, ii, n(_vhs_size);
  HalfedgeHandle                 inner_next, inner_prev,
                                 outer_next, outer_prev,
                                 boundary_next, boundary_prev,
                                 patch_start, patch_end;


  // Check sufficient working storage available
  if (edgeData_.size() < n)
  {
    edgeData_.resize(n);
    next_cache_.resize(6*n);
  }
  next_cache_count_ = 0;

  // don't allow degenerated faces
  assert (n > 2);

  // test for topological errors
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if ( !is_boundary(_vertex_handles[i]) )
    {
      omerr() << "PolyMeshT::add_face: complex vertex\n";
      return InvalidFaceHandle;
    }

    // Initialise edge attributes
    edgeData_[i].halfedge_handle = find_halfedge(_vertex_handles[i],
                                                 _vertex_handles[ii]);
    edgeData_[i].is_new = !edgeData_[i].halfedge_handle.is_valid();
    edgeData_[i].needs_adjust = false;

    if (!edgeData_[i].is_new && !is_boundary(edgeData_[i].halfedge_handle))
    {
      omerr() << "PolyMeshT::add_face: complex edge\n";
      return InvalidFaceHandle;
    }
  }

  // re-link patches if necessary
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if (!edgeData_[i].is_new && !edgeData_[ii].is_new)
    {
      inner_prev = edgeData_[i].halfedge_handle;
      inner_next = edgeData_[ii].halfedge_handle;


      if (next_halfedge_handle(inner_prev) != inner_next)
      {
        // here comes the ugly part... we have to relink a whole patch

        // search a free gap
        // free gap will be between boundary_prev and boundary_next
        outer_prev = opposite_halfedge_handle(inner_next);
        outer_next = opposite_halfedge_handle(inner_prev);
        boundary_prev = outer_prev;
        do
          boundary_prev =
            opposite_halfedge_handle(next_halfedge_handle(boundary_prev));
        while (!is_boundary(boundary_prev) || boundary_prev==inner_prev);
        boundary_next = next_halfedge_handle(boundary_prev);
        assert(is_boundary(boundary_prev));
        assert(is_boundary(boundary_next));
        // ok ?
        if (boundary_next == inner_next)
        {
          omerr() << "PolyMeshT::add_face: patch re-linking failed\n";
          return InvalidFaceHandle;
        }

        // other halfedges' handles
        patch_start = next_halfedge_handle(inner_prev);
        patch_end   = prev_halfedge_handle(inner_next);

        assert(boundary_prev.is_valid());
        assert(patch_start.is_valid());
        assert(patch_end.is_valid());
        assert(boundary_next.is_valid());
        assert(inner_prev.is_valid());
        assert(inner_next.is_valid());

        // relink
        next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, patch_start);
        next_cache_[next_cache_count_++] = std::make_pair(patch_end, boundary_next);
        next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
      }
    }
  }

  // create missing edges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
    if (edgeData_[i].is_new)
      edgeData_[i].halfedge_handle = new_edge(_vertex_handles[i], _vertex_handles[ii]);

  // create the face
  FaceHandle fh(new_face());
  set_halfedge_handle(fh, edgeData_[n-1].halfedge_handle);

  // setup halfedges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    vh         = _vertex_handles[ii];

    inner_prev = edgeData_[i].halfedge_handle;
    inner_next = edgeData_[ii].halfedge_handle;
    assert(inner_prev.is_valid());
    assert(inner_next.is_valid());

    size_t id = 0;
    if (edgeData_[i].is_new)  id |= 1;
    if (edgeData_[ii].is_new) id |= 2;


    if (id)
    {
      outer_prev = opposite_halfedge_handle(inner_next);
      outer_next = opposite_halfedge_handle(inner_prev);
      assert(outer_prev.is_valid());
      assert(outer_next.is_valid());

      // set outer links
      switch (id)
      {
        case 1: // prev is new, next is old
          boundary_prev = prev_halfedge_handle(inner_next);
          assert(boundary_prev.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
          set_halfedge_handle(vh, outer_next);
          break;

        case 2: // next is new, prev is old
          boundary_next = next_halfedge_handle(inner_prev);
          assert(boundary_next.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          set_halfedge_handle(vh, boundary_next);
          break;

        case 3: // both are new
          if (!halfedge_handle(vh).is_valid())
          {
            set_halfedge_handle(vh, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, outer_next);
          }
          else
          {
            boundary_next = halfedge_handle(vh);
            boundary_prev = prev_halfedge_handle(boundary_next);
            assert(boundary_prev.is_valid());
            assert(boundary_next.is_valid());
            next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          }
          break;
      }

      // set inner link
      next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
    }
    else edgeData_[ii].needs_adjust = (halfedge_handle(vh) == inner_next);


    // set face handle
    set_face_handle(edgeData_[i].halfedge_handle, fh);
  }

  // process next halfedge cache
  for (i = 0; i < next_cache_count_; ++i)
    set_next_halfedge_handle(next_cache_[i].first, next_cache_[i].second);


  // adjust vertices' halfedge handle
  for (i=0; i<n; ++i)
    if (edgeData_[i].needs_adjust)
      adjust_outgoing_halfedge(_vertex_handles[i]);

  return fh;
}